

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bad_alloc *anon_var_0;
  string local_110 [55];
  allocator local_d9;
  string local_d8 [32];
  _union_1457 _Stack_b8;
  sigaction sa;
  int opt;
  char **argv_local;
  int argc_local;
  
  sa.sa_restorer._4_4_ = getopt(argc,argv,"vhs");
  if (sa.sa_restorer._4_4_ == -1) {
    progname = *argv;
    sa.sa_mask.__val[0xe] = 0;
    sa.sa_mask.__val[0xf] = 0;
    sa.sa_mask.__val[0xc] = 0;
    sa.sa_mask.__val[0xd] = 0;
    sa.sa_mask.__val[10] = 0;
    sa.sa_mask.__val[0xb] = 0;
    sa.sa_mask.__val[8] = 0;
    sa.sa_mask.__val[9] = 0;
    sa.sa_mask.__val[6] = 0;
    sa.sa_mask.__val[7] = 0;
    sa.sa_mask.__val[4] = 0;
    sa.sa_mask.__val[5] = 0;
    sa.sa_mask.__val[2] = 0;
    sa.sa_mask.__val[3] = 0;
    sa.sa_mask.__val[0] = 0;
    sa.sa_mask.__val[1] = 0;
    _Stack_b8.sa_handler = (__sighandler_t)0x0;
    sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
    sa.sa_flags = 0;
    sa._140_4_ = 0;
    sigemptyset((sigset_t *)&sa);
    _Stack_b8.sa_handler = segfault_sigaction;
    sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
    sigaction(0xb,(sigaction *)&_Stack_b8,(sigaction *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"",&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"",(allocator *)((long)&anon_var_0 + 7));
    initstreams((string *)local_d8,(string *)local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    gulsummaryxreftocsv::doit();
    return 0;
  }
  if ((sa.sa_restorer._4_4_ != 0x68) && (sa.sa_restorer._4_4_ == 0x76)) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
    exit(1);
  }
  help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[])
{

	int opt;
	while ((opt = getopt(argc, argv, "vhs")) != -1) {
		switch (opt) {
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

	progname = argv[0];
#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams("", "");
		gulsummaryxreftocsv::doit();
		return EXIT_SUCCESS;
	}catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
}